

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ArrayPtr<const_unsigned_char> __thiscall capnp::_::ListReader::asRawBytes(ListReader *this)

{
  byte *pbVar1;
  ulong uVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  DebugComparison<const_unsigned_short_&,_unsigned_int> _kjCondition;
  Fault f;
  
  _kjCondition.left = &this->structPointerCount;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = this->structPointerCount == 0;
  if (_kjCondition.result) {
    pbVar1 = this->ptr;
    uVar2 = (ulong)this->structDataSize * (ulong)this->elementCount + 7 >> 3;
  }
  else {
    uVar2 = 0;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short_const&,unsigned_int>&,char_const(&)[51]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc53,FAILED,"structPointerCount == ZERO * POINTERS",
               "_kjCondition,\"Schema mismatch: Expected data only, got pointers.\"",&_kjCondition,
               (char (*) [51])"Schema mismatch: Expected data only, got pointers.");
    kj::_::Debug::Fault::~Fault(&f);
    pbVar1 = (byte *)0x0;
  }
  AVar3.size_ = uVar2;
  AVar3.ptr = pbVar1;
  return AVar3;
}

Assistant:

kj::ArrayPtr<const byte> ListReader::asRawBytes() const {
  KJ_REQUIRE(structPointerCount == ZERO * POINTERS,
             "Schema mismatch: Expected data only, got pointers.") {
    return kj::ArrayPtr<const byte>();
  }

  return arrayPtr(reinterpret_cast<const byte*>(ptr),
      WireHelpers::roundBitsUpToBytes(
          upgradeBound<uint64_t>(elementCount) * (structDataSize / ELEMENTS)));
}